

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void R_RenderFakeWallRange(drawseg_t *ds,int x1,int x2)

{
  uint uVar1;
  sector_t *psVar2;
  extsector_t *peVar3;
  secplane_t *psVar4;
  secplane_t *psVar5;
  int iVar6;
  sector_t *sec;
  seg_t **ppsVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  F3DFloor *pFVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  ulong uVar15;
  lightlist_t *plVar16;
  F3DFloor *rover;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  long lStack_60;
  
  sprflipvert = false;
  curline = ds->curline;
  frontsector = curline->frontsector;
  psVar2 = curline->backsector;
  if (psVar2 == (sector_t *)0x0) {
    backsector = psVar2;
    sprflipvert = false;
    return;
  }
  backsector = psVar2;
  if ((ds->bFakeBoundary & 3) == 2) {
    backsector = frontsector;
    frontsector = psVar2;
  }
  dVar18 = sector_t::CenterFloor(backsector);
  dVar19 = sector_t::CenterCeiling(backsector);
  if ((fake3D & 1U) == 0) {
    sclipBottom = dVar18;
  }
  dVar21 = sclipBottom;
  if ((fake3D & 2U) == 0) {
    sclipTop = dVar19;
  }
  dVar20 = sector_t::CenterCeiling(frontsector);
  dVar22 = sclipTop;
  if (dVar20 <= dVar21) {
    return;
  }
  dVar21 = sector_t::CenterFloor(frontsector);
  if (dVar22 <= dVar21) {
    return;
  }
  peVar3 = backsector->e;
  uVar8 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  uVar13 = (ulong)uVar8;
  if ((fake3D & 8U) != 0) {
    bVar14 = true;
LAB_00332cbf:
    do {
      do {
        uVar13 = uVar13 - 1;
        uVar8 = (uint)uVar13;
        if ((int)uVar8 < 0) {
          return;
        }
        rover = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                [uVar8 & 0x7fffffff];
        uVar1 = rover->flags;
      } while ((uVar1 & 1) == 0);
      if ((((((uVar1 & 4) == 0) ||
            (psVar4 = (rover->top).plane, (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0))
           || (psVar5 = (rover->bottom).plane,
              (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0)) ||
          ((dVar21 = psVar4->D * psVar4->negiC, dVar21 <= sclipBottom ||
           (dVar19 <= psVar5->D * psVar5->negiC)))) || (dVar21 <= dVar18)) {
        if (uVar8 != 0) goto LAB_00332cbf;
        bVar17 = true;
      }
      else {
        bVar17 = false;
      }
      rw_pic = (FTexture *)0x0;
      if ((bVar17) || (psVar4 = (rover->bottom).plane, sclipTop <= psVar4->D * psVar4->negiC)) {
        if (!bVar14) {
          rw_pic = (FTexture *)0x0;
          return;
        }
        pFVar11 = (F3DFloor *)0x0;
        uVar8 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        goto LAB_0033309e;
      }
      uVar15 = (ulong)(frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar15 == 0) goto LAB_00333460;
      pFVar11 = (F3DFloor *)0x0;
      do {
        uVar15 = uVar15 - 1;
        if (((int)(uint)uVar15 < 0) ||
           (pFVar11 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                      [(uint)uVar15 & 0x7fffffff], pFVar11->model == rover->model)) {
          bVar17 = pFVar11 != (F3DFloor *)0x0;
          goto LAB_00332e49;
        }
        uVar8 = pFVar11->flags;
      } while ((((~uVar8 & 5) != 0) ||
               (psVar4 = (pFVar11->top).plane,
               (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0)) ||
              ((psVar5 = (pFVar11->bottom).plane,
               (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0 ||
               (psVar4->D * psVar4->negiC <= sclipBottom))));
      if (sclipTop <= psVar5->D * psVar5->negiC) goto LAB_00333460;
      if ((uVar8 & 2) != (uVar1 & 2)) {
LAB_00332eb1:
        if ((uVar1 & uVar8 & 0x10) != 0) {
          rw_pic = (FTexture *)0xffffffffffffffff;
          goto LAB_003334a8;
        }
        goto LAB_00333460;
      }
      bVar17 = true;
      if (((uVar8 & 2) == 0) && ((pFVar11->alpha == 0xff || (bVar17 = true, rover->alpha == 0xff))))
      goto LAB_00332eb1;
LAB_00332e49:
      if ((uVar15 == 0xffffffffffffffff) || (bVar14 = false, !bVar17)) goto LAB_00333460;
    } while( true );
  }
  uVar15 = 0;
  if ((int)uVar8 < 1) {
    uVar13 = uVar15;
  }
  while( true ) {
    if (uVar13 == uVar15) {
      return;
    }
    rover = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar15];
    uVar1 = rover->flags;
    if ((uVar1 & 1) != 0) break;
LAB_00332ca3:
    uVar15 = uVar15 + 1;
  }
  if (((((uVar1 & 4) == 0) ||
       (psVar4 = (rover->top).plane, (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0)) ||
      (psVar5 = (rover->bottom).plane, (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0)) ||
     (((dVar21 = psVar5->D * psVar5->negiC, sclipTop <= dVar21 ||
       (dVar22 = psVar4->D * psVar4->negiC, dVar22 <= dVar18)) || (dVar19 <= dVar21)))) {
    if (uVar8 - 1 != uVar15) goto LAB_00332ca3;
    psVar4 = (rover->top).plane;
    dVar22 = psVar4->D * psVar4->negiC;
    bVar14 = true;
  }
  else {
    bVar14 = false;
  }
  rw_pic = (FTexture *)0x0;
  peVar3 = frontsector->e;
  if ((bVar14) || (dVar22 <= sclipBottom)) {
    uVar8 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    uVar13 = 0;
    uVar15 = 0;
    if (0 < (int)uVar8) {
      uVar15 = (ulong)uVar8;
    }
    pFVar11 = (F3DFloor *)0x0;
    for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      pFVar11 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar13];
      if (pFVar11->model == rover->model) {
        rw_pic = (FTexture *)0x0;
        return;
      }
      if (((((~pFVar11->flags & 5) == 0) &&
           (psVar4 = (pFVar11->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0))
          && (psVar5 = (pFVar11->bottom).plane,
             (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0)) &&
         (psVar5->D * psVar5->negiC < sclipTop)) {
        if ((pFVar11->flags & 0x2200) == 0) {
          rw_pic = (FTexture *)0x0;
          return;
        }
        if (psVar4->D * psVar4->negiC <= sclipBottom) {
          rw_pic = (FTexture *)0x0;
          return;
        }
        uVar15 = uVar13 & 0xffffffff;
        goto LAB_00333051;
      }
    }
    if (pFVar11 == (F3DFloor *)0x0) {
      rw_pic = (FTexture *)0x0;
      return;
    }
LAB_00333051:
    if ((uint)uVar15 == uVar8) {
      rw_pic = (FTexture *)0x0;
      return;
    }
    uVar8 = pFVar11->flags;
    if ((uVar1 & uVar8 & 0x10) == 0) {
      lVar9 = 0x10;
      ppsVar7 = &curline;
      if ((uVar8 >> 0x11 & 1) == 0) {
        lVar10 = 0x90;
        if ((uVar8 >> 0x12 & 1) == 0) {
          ppsVar7 = (seg_t **)&pFVar11->master;
          lVar10 = 0x60;
          lVar9 = 0x48;
        }
      }
      else {
        lVar10 = 0x30;
      }
      rw_pic = FTextureManager::operator()
                         (&TexMan,(FTextureID)
                                  *(int *)(*(long *)((long)((line_t *)*ppsVar7)->args +
                                                    lVar9 + -0x2c) + lVar10),true);
      if (rw_pic == (FTexture *)0x0) goto LAB_00333226;
    }
    else {
      rw_pic = (FTexture *)0xffffffffffffffff;
    }
  }
  else {
    uVar8 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar8 != 0) {
      uVar13 = 0;
      uVar15 = 0;
      if (0 < (int)uVar8) {
        uVar15 = (ulong)uVar8;
      }
      pFVar11 = (F3DFloor *)0x0;
      for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
        pFVar11 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar13];
        if (pFVar11->model == rover->model) {
LAB_0033321a:
          uVar15 = uVar13 & 0xffffffff;
          goto LAB_0033321d;
        }
        uVar12 = pFVar11->flags;
        if ((((~uVar12 & 5) == 0) &&
            (psVar4 = (pFVar11->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0))
           && ((psVar5 = (pFVar11->bottom).plane,
               (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0 &&
               (psVar5->D * psVar5->negiC < sclipTop)))) {
          if (psVar4->D * psVar4->negiC <= sclipBottom) goto LAB_00333226;
          if (((uVar12 & 2) == (uVar1 & 2)) &&
             (((uVar12 & 2) != 0 || ((pFVar11->alpha != 0xff && (rover->alpha != 0xff))))))
          goto LAB_0033321a;
          if ((uVar1 & uVar12 & 0x10) == 0) goto LAB_00333226;
          rw_pic = (FTexture *)0xffffffffffffffff;
          goto LAB_0033326d;
        }
      }
      if (pFVar11 != (F3DFloor *)0x0) {
LAB_0033321d:
        if ((uint)uVar15 != uVar8) {
          rw_pic = (FTexture *)0x0;
          return;
        }
      }
    }
LAB_00333226:
    rw_pic = (FTexture *)0x0;
    lVar9 = 0x10;
    ppsVar7 = &curline;
    if ((rover->flags >> 0x11 & 1) == 0) {
      lVar10 = 0x90;
      if ((rover->flags >> 0x12 & 1) == 0) {
        ppsVar7 = (seg_t **)&rover->master;
        lVar10 = 0x60;
        lVar9 = 0x48;
      }
    }
    else {
      lVar10 = 0x30;
    }
    rw_pic = FTextureManager::operator()
                       (&TexMan,(FTextureID)
                                *(int *)(*(long *)((long)((line_t *)*ppsVar7)->args + lVar9 + -0x2c)
                                        + lVar10),true);
LAB_0033326d:
    pFVar11 = (F3DFloor *)0x0;
  }
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      uVar8 = (backsector->e->XFloor).lightlist.Count;
      do {
        uVar8 = uVar8 - 1;
        if ((int)uVar8 < 0) goto LAB_003333a7;
        uVar13 = (ulong)(uVar8 & 0x7fffffff);
        plVar16 = (backsector->e->XFloor).lightlist.Array;
      } while (plVar16[uVar13].plane.D * plVar16[uVar13].plane.negiC < sclipTop);
    }
    else {
      uVar8 = (frontsector->e->XFloor).lightlist.Count;
      do {
        uVar8 = uVar8 - 1;
        if ((int)uVar8 < 0) goto LAB_003333a7;
        uVar13 = (ulong)(uVar8 & 0x7fffffff);
        plVar16 = (frontsector->e->XFloor).lightlist.Array;
      } while (plVar16[uVar13].plane.D * plVar16[uVar13].plane.negiC < sclipTop);
    }
    basecolormap = plVar16[uVar13].extra_colormap;
    iVar6 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar16[uVar13].p_lightlevel,
                       plVar16[uVar13].lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar6 + r_actualextralight) * -0x4000 + 0x3d0000;
  }
LAB_003333a7:
  if (rw_pic == (FTexture *)0xffffffffffffffff) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if (pFVar11 != (F3DFloor *)0x0) {
    rover = pFVar11;
  }
LAB_003333bc:
  R_RenderFakeWall(ds,x1,x2,rover);
  return;
  while( true ) {
    pFVar11 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
              [uVar8 & 0x7fffffff];
    if (pFVar11->model == rover->model) {
      rw_pic = (FTexture *)0x0;
      return;
    }
    if (((((~pFVar11->flags & 5) == 0) &&
         (psVar4 = (pFVar11->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
        (psVar5 = (pFVar11->bottom).plane, (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0))
       && (sclipBottom < psVar4->D * psVar4->negiC)) break;
LAB_0033309e:
    uVar12 = uVar8;
    uVar8 = uVar12 - 1;
    if ((int)uVar8 < 0) goto LAB_00333150;
  }
  if (sclipTop <= psVar5->D * psVar5->negiC) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if ((pFVar11->flags & 0x2200) == 0) {
    pFVar11 = (F3DFloor *)0x0;
  }
LAB_00333150:
  if (uVar12 == 0) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if (pFVar11 == (F3DFloor *)0x0) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  uVar8 = pFVar11->flags;
  if ((uVar1 & uVar8 & 0x10) == 0) {
    lVar9 = 0x10;
    ppsVar7 = &curline;
    if ((uVar8 >> 0x11 & 1) == 0) {
      lVar10 = 0x90;
      if ((uVar8 >> 0x12 & 1) == 0) {
        ppsVar7 = (seg_t **)&pFVar11->master;
        lVar10 = 0x60;
        lVar9 = 0x48;
      }
    }
    else {
      lVar10 = 0x30;
    }
    rw_pic = FTextureManager::operator()
                       (&TexMan,(FTextureID)
                                *(int *)(*(long *)((long)((line_t *)*ppsVar7)->args + lVar9 + -0x2c)
                                        + lVar10),true);
    if (rw_pic == (FTexture *)0x0) {
LAB_00333460:
      if ((rover->flags >> 0x11 & 1) == 0) {
        lStack_60 = 0x90;
        ppsVar7 = &curline;
        lVar9 = 0x10;
        if ((rover->flags >> 0x12 & 1) == 0) {
          ppsVar7 = (seg_t **)&rover->master;
          lVar9 = 0x48;
          lStack_60 = 0x60;
        }
      }
      else {
        ppsVar7 = &curline;
        lVar9 = 0x10;
        lStack_60 = 0x30;
      }
      rw_pic = FTextureManager::operator()
                         (&TexMan,(FTextureID)
                                  *(int *)(*(long *)((long)((line_t *)*ppsVar7)->args +
                                                    lVar9 + -0x2c) + lStack_60),true);
LAB_003334a8:
      pFVar11 = (F3DFloor *)0x0;
    }
  }
  else {
    rw_pic = (FTexture *)0xffffffffffffffff;
  }
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      uVar8 = (backsector->e->XFloor).lightlist.Count;
      do {
        uVar8 = uVar8 - 1;
        if ((int)uVar8 < 0) goto LAB_003335db;
        uVar13 = (ulong)(uVar8 & 0x7fffffff);
        plVar16 = (backsector->e->XFloor).lightlist.Array;
      } while (plVar16[uVar13].plane.D * plVar16[uVar13].plane.negiC < sclipTop);
    }
    else {
      uVar8 = (frontsector->e->XFloor).lightlist.Count;
      do {
        uVar8 = uVar8 - 1;
        if ((int)uVar8 < 0) goto LAB_003335db;
        uVar13 = (ulong)(uVar8 & 0x7fffffff);
        plVar16 = (frontsector->e->XFloor).lightlist.Array;
      } while (plVar16[uVar13].plane.D * plVar16[uVar13].plane.negiC < sclipTop);
    }
    basecolormap = plVar16[uVar13].extra_colormap;
    iVar6 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar16[uVar13].p_lightlevel,
                       plVar16[uVar13].lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar6 + r_actualextralight) * -0x4000 + 0x3d0000;
  }
LAB_003335db:
  if (rw_pic == (FTexture *)0xffffffffffffffff) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if (pFVar11 != (F3DFloor *)0x0) {
    rover = pFVar11;
  }
  goto LAB_003333bc;
}

Assistant:

void R_RenderFakeWallRange (drawseg_t *ds, int x1, int x2)
{
	FTexture *const DONT_DRAW = ((FTexture*)(intptr_t)-1);
	int i,j;
	F3DFloor *rover, *fover = NULL;
	int passed, last;
	double floorHeight;
	double ceilingHeight;

	sprflipvert = false;
	curline = ds->curline;

	frontsector = curline->frontsector;
	backsector = curline->backsector;

	if (backsector == NULL)
	{
		return;
	}
	if ((ds->bFakeBoundary & 3) == 2)
	{
		sector_t *sec = backsector;
		backsector = frontsector;
		frontsector = sec;
	}

	floorHeight = backsector->CenterFloor();
	ceilingHeight = backsector->CenterCeiling();

	// maybe fix clipheights
	if (!(fake3D & FAKE3D_CLIPBOTTOM)) sclipBottom = floorHeight;
	if (!(fake3D & FAKE3D_CLIPTOP))    sclipTop = ceilingHeight;

	// maybe not visible
	if (sclipBottom >= frontsector->CenterCeiling()) return;
	if (sclipTop <= frontsector->CenterFloor()) return;

	if (fake3D & FAKE3D_DOWN2UP)
	{ // bottom to viewz
		last = 0;
		for (i = backsector->e->XFloor.ffloors.Size() - 1; i >= 0; i--) 
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) || rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->top.plane->Zat0() <= sclipBottom ||
				rover->bottom.plane->Zat0() >= ceilingHeight ||
				rover->top.plane->Zat0() <= floorHeight)
			{
				if (!i)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}

			rw_pic = NULL;
			if (rover->bottom.plane->Zat0() >= sclipTop || passed) 
			{
				if (last)
				{
					break;
				}
				// maybe wall from inside rendering?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || j == -1)
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{	// don't ever draw (but treat as something has been found)
					rw_pic = DONT_DRAW;
				}
				else if(fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			} 
			else if (frontsector->e->XFloor.ffloors.Size()) 
			{
				// maybe not visible?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model) // never
					{
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(fover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && j != -1)
				{
					fover = NULL;
					last = 1;
					continue; // not visible
				}
			}
			if (!rw_pic) 
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}
			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else rw_pic = NULL;
			break;
		}
	}
	else
	{ // top to viewz
		for (i = 0; i < (int)backsector->e->XFloor.ffloors.Size(); i++)
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) ||
				rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->bottom.plane->Zat0() >= sclipTop ||
				rover->top.plane->Zat0() <= floorHeight ||
				rover->bottom.plane->Zat0() >= ceilingHeight)
			{
				if ((unsigned)i == backsector->e->XFloor.ffloors.Size() - 1)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}
			rw_pic = NULL;
			if (rover->top.plane->Zat0() <= sclipBottom || passed)
			{ // maybe wall from inside rendering?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || (unsigned)j == frontsector->e->XFloor.ffloors.Size())
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{
					rw_pic = DONT_DRAW;	// don't ever draw (but treat as something has been found)
				}
				else if (fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			else if (frontsector->e->XFloor.ffloors.Size())
			{ // maybe not visible?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, its bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(rover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && (unsigned)j != frontsector->e->XFloor.ffloors.Size())
				{ // not visible
					break;
				}
			}
			if (rw_pic == NULL)
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if(sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}

			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else
			{
				rw_pic = NULL;
			}
			break;
		}
	}
	return;
}